

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int vcf_hdr_write(htsFile *fp,bcf_hdr_t *h)

{
  undefined8 in_RAX;
  char *buffer;
  long lVar1;
  size_t nbytes;
  ssize_t sVar2;
  int iVar3;
  long lVar4;
  int hlen;
  undefined8 uStack_28;
  
  nbytes = 0;
  uStack_28 = in_RAX;
  buffer = bcf_hdr_fmt_text(h,0,(int *)((long)&uStack_28 + 4));
  lVar1 = (long)uStack_28._4_4_ << 0x20;
  lVar4 = (long)uStack_28._4_4_;
  iVar3 = uStack_28._4_4_;
  do {
    iVar3 = iVar3 + -1;
    if (lVar4 == 0) {
LAB_00116923:
      if ((fp->format).compression == no_compression) {
        sVar2 = hwrite((hFILE *)(fp->fp).bgzf,buffer,nbytes);
        iVar3 = (int)sVar2;
      }
      else {
        sVar2 = bgzf_write((fp->fp).bgzf,buffer,nbytes);
        iVar3 = (int)sVar2;
      }
      free(buffer);
      return (int)((ulong)(long)iVar3 >> 0x1f);
    }
    if (buffer[lVar4 + -1] != '\0') {
      nbytes = lVar1 >> 0x20;
      goto LAB_00116923;
    }
    uStack_28 = CONCAT44(iVar3,(undefined4)uStack_28);
    lVar1 = lVar1 + -0x100000000;
    lVar4 = lVar4 + -1;
  } while( true );
}

Assistant:

int vcf_hdr_write(htsFile *fp, const bcf_hdr_t *h)
{
    int hlen;
    char *htxt = bcf_hdr_fmt_text(h, 0, &hlen);
    while (hlen && htxt[hlen-1] == 0) --hlen; // kill trailing zeros
    int ret;
    if ( fp->format.compression!=no_compression )
        ret = bgzf_write(fp->fp.bgzf, htxt, hlen);
    else
        ret = hwrite(fp->fp.hfile, htxt, hlen);
    free(htxt);
    return ret<0 ? -1 : 0;
}